

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::generateRetransmits(Session *this,SEQNUM beginSeqNo,SEQNUM endSeqNo)

{
  pointer pcVar1;
  bool bVar2;
  DataDictionary *dataDictionary;
  DataDictionary *applicationDataDictionary;
  message_order *pmVar3;
  message_order *pmVar4;
  message_order *pmVar5;
  Message *this_00;
  uint64_t uVar6;
  void *pvVar7;
  uint64_t uVar8;
  string *string;
  IntTConvertor<unsigned_long> *this_01;
  long *plVar9;
  _func_int **pp_Var10;
  unsigned_long value;
  SessionState *this_02;
  SEQNUM SVar11;
  uint64_t local_390;
  string *local_388;
  string strMsgType;
  string messageString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  ApplVerID applVerID;
  undefined1 local_290 [16];
  _Alloc_hider local_280;
  char local_270 [16];
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  field_metrics local_240;
  MsgSeqNum msgSeqNum;
  Message msg;
  MsgType msgType;
  
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  messages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_02 = &this->m_state;
  SessionState::get(this_02,beginSeqNo,endSeqNo,&messages);
  UInt64Field::UInt64Field(&msgSeqNum.super_SeqNumField,0x22,0);
  msgSeqNum.super_SeqNumField.super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_001f6e60;
  StringField::StringField(&msgType.super_StringField,0x23);
  msgType.super_StringField.super_FieldBase._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f6658
  ;
  messageString._M_dataplus._M_p = (pointer)&messageString.field_2;
  messageString._M_string_length = 0;
  messageString.field_2._M_local_buf[0] = '\0';
  local_388 = messages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  if (messages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      messages.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = false;
  }
  else {
    local_390 = 0;
    SVar11 = beginSeqNo;
    do {
      strMsgType._M_dataplus._M_p = (pointer)&strMsgType.field_2;
      strMsgType._M_string_length = 0;
      strMsgType.field_2._M_local_buf[0] = '\0';
      dataDictionary =
           DataDictionaryProvider::getSessionDataDictionary
                     (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
      if (dataDictionary->m_storeMsgFieldsOrder == true) {
        std::__cxx11::string::find((char *)local_388,0x1cde84,0);
        std::__cxx11::string::find((char)local_388,1);
        std::__cxx11::string::substr((ulong)&msg,(ulong)local_388);
        std::__cxx11::string::operator=((string *)&strMsgType,(string *)&msg);
        if ((pointer *)msg.super_FieldMap._vptr_FieldMap !=
            &msg.super_FieldMap.m_fields.
             super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(msg.super_FieldMap._vptr_FieldMap,
                          (ulong)((long)&(msg.super_FieldMap.m_fields.
                                          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                         _vptr_FieldBase + 1));
        }
      }
      if ((this->m_sessionID).m_isFIXT == true) {
        Message::Message(&msg);
        Message::setStringHeader(&msg,local_388);
        StringField::StringField((StringField *)&applVerID,0x468);
        applVerID.super_StringField.super_FieldBase._vptr_FieldBase =
             (_func_int **)&PTR__FieldBase_001f7058;
        bVar2 = FieldMap::getFieldIfSet(&msg.m_header.super_FieldMap,(FieldBase *)&applVerID);
        if (!bVar2) {
          local_290._0_8_ = &PTR__FieldBase_001f55c8;
          local_290._8_4_ = 0x468;
          local_280._M_p = local_270;
          pcVar1 = (this->m_senderDefaultApplVerID)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,pcVar1,
                     pcVar1 + (this->m_senderDefaultApplVerID)._M_string_length);
          local_260._M_p = (pointer)&local_250;
          local_258 = 0;
          local_250._M_local_buf[0] = '\0';
          local_240.m_length = 0;
          local_240.m_checksum = 0;
          local_290._0_8_ = &PTR__FieldBase_001f7058;
          applVerID.super_StringField.super_FieldBase.m_tag = local_290._8_4_;
          std::__cxx11::string::_M_assign
                    ((string *)&applVerID.super_StringField.super_FieldBase.m_string);
          applVerID.super_StringField.super_FieldBase.m_metrics = local_240;
          applVerID.super_StringField.super_FieldBase.m_data._M_string_length = 0;
          *applVerID.super_StringField.super_FieldBase.m_data._M_dataplus._M_p = '\0';
          FieldBase::~FieldBase((FieldBase *)local_290);
        }
        applicationDataDictionary =
             DataDictionaryProvider::getApplicationDataDictionary
                       (&this->m_dataDictionaryProvider,&applVerID);
        if (strMsgType._M_string_length == 0) {
          this_00 = (Message *)operator_new(0x158);
          Message::Message(this_00,local_388,dataDictionary,applicationDataDictionary,
                           this->m_validateLengthAndChecksum);
        }
        else {
          pmVar3 = DataDictionary::getHeaderOrderedFields(dataDictionary);
          pmVar4 = DataDictionary::getTrailerOrderedFields(dataDictionary);
          pmVar5 = DataDictionary::getMessageOrderedFields(applicationDataDictionary,&strMsgType);
          this_00 = (Message *)operator_new(0x158);
          Message::Message(this_00,pmVar3,pmVar4,pmVar5,local_388,dataDictionary,
                           applicationDataDictionary,this->m_validateLengthAndChecksum);
        }
        FieldBase::~FieldBase((FieldBase *)&applVerID);
        Message::~Message(&msg);
      }
      else if (strMsgType._M_string_length == 0) {
        this_00 = (Message *)operator_new(0x158);
        Message::Message(this_00,local_388,dataDictionary,this->m_validateLengthAndChecksum);
      }
      else {
        pmVar3 = DataDictionary::getHeaderOrderedFields(dataDictionary);
        pmVar4 = DataDictionary::getTrailerOrderedFields(dataDictionary);
        pmVar5 = DataDictionary::getMessageOrderedFields(dataDictionary,&strMsgType);
        this_00 = (Message *)operator_new(0x158);
        Message::Message(this_00,pmVar3,pmVar4,pmVar5,local_388,dataDictionary,
                         this->m_validateLengthAndChecksum);
      }
      FieldMap::getField(&(this_00->m_header).super_FieldMap,(FieldBase *)&msgSeqNum);
      FieldMap::getField(&(this_00->m_header).super_FieldMap,(FieldBase *)&msgType);
      uVar6 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      uVar8 = SVar11;
      if (local_390 != 0) {
        uVar8 = local_390;
      }
      if (SVar11 != uVar6) {
        local_390 = uVar8;
      }
      if (((msgType.super_StringField.super_FieldBase.m_string._M_string_length == 1) &&
          (pvVar7 = memchr("0A12345",
                           (int)*msgType.super_StringField.super_FieldBase.m_string._M_dataplus._M_p
                           ,8), pvVar7 != (void *)0x0)) || (bVar2 = resend(this,this_00), !bVar2)) {
        if (local_390 == 0) {
          local_390 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
        }
        bVar2 = false;
      }
      else {
        if (local_390 != 0) {
          uVar8 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
          generateSequenceReset(this,local_390,uVar8);
        }
        string = Message::toString(this_00,&messageString,8,9,10);
        if (this->m_pResponder != (Responder *)0x0) {
          SessionState::onOutgoing(this_02,string);
          (*this->m_pResponder->_vptr_Responder[2])(this->m_pResponder,string);
        }
        this_01 = (IntTConvertor<unsigned_long> *)
                  UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
        IntTConvertor<unsigned_long>::convert_abi_cxx11_((string *)&applVerID,this_01,value);
        plVar9 = (long *)std::__cxx11::string::replace((ulong)&applVerID,0,(char *)0x0,0x1cde89);
        msg.super_FieldMap._vptr_FieldMap =
             (_func_int **)
             &msg.super_FieldMap.m_fields.
              super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
              super__Vector_impl_data._M_finish;
        pp_Var10 = (_func_int **)(plVar9 + 2);
        if ((_func_int **)*plVar9 == pp_Var10) {
          msg.super_FieldMap.m_fields.
          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)*pp_Var10;
          msg.super_FieldMap.m_fields.
          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)plVar9[3];
        }
        else {
          msg.super_FieldMap.m_fields.
          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)*pp_Var10;
          msg.super_FieldMap._vptr_FieldMap = (_func_int **)*plVar9;
        }
        msg.super_FieldMap.m_fields.
        super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)plVar9[1];
        *plVar9 = (long)pp_Var10;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        SessionState::onEvent(this_02,(string *)&msg);
        if ((pointer *)msg.super_FieldMap._vptr_FieldMap !=
            &msg.super_FieldMap.m_fields.
             super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete(msg.super_FieldMap._vptr_FieldMap,
                          (ulong)((long)&(msg.super_FieldMap.m_fields.
                                          super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->
                                         _vptr_FieldBase + 1));
        }
        if ((string *)applVerID.super_StringField.super_FieldBase._vptr_FieldBase !=
            &applVerID.super_StringField.super_FieldBase.m_string) {
          operator_delete(applVerID.super_StringField.super_FieldBase._vptr_FieldBase,
                          (ulong)(applVerID.super_StringField.super_FieldBase.m_string._M_dataplus.
                                  _M_p + 1));
        }
        bVar2 = true;
        local_390 = 0;
      }
      uVar8 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)strMsgType._M_dataplus._M_p != &strMsgType.field_2) {
        operator_delete(strMsgType._M_dataplus._M_p,
                        CONCAT71(strMsgType.field_2._M_allocated_capacity._1_7_,
                                 strMsgType.field_2._M_local_buf[0]) + 1);
      }
      SVar11 = uVar8 + 1;
      (*(this_00->super_FieldMap)._vptr_FieldMap[1])(this_00);
      local_388 = local_388 + 1;
    } while (local_388 !=
             messages.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (local_390 != 0) {
      uVar8 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      generateSequenceReset(this,local_390,uVar8 + 1);
    }
  }
  uVar8 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
  if (uVar8 < endSeqNo) {
    UInt64Field::UInt64Field((UInt64Field *)&msg,0x10,endSeqNo + 1);
    msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001f6f78;
    uVar8 = UInt64Field::getValue((UInt64Field *)&msg);
    FieldBase::~FieldBase((FieldBase *)&msg);
    SVar11 = SessionState::getNextSenderMsgSeqNum(this_02);
    if (SVar11 < uVar8) {
      UInt64Field::UInt64Field((UInt64Field *)&msg,0x10,SVar11);
      msg.super_FieldMap._vptr_FieldMap = (_func_int **)&PTR__FieldBase_001f6f78;
      uVar8 = UInt64Field::getValue((UInt64Field *)&msg);
      FieldBase::~FieldBase((FieldBase *)&msg);
    }
    if (bVar2) {
      uVar6 = UInt64Field::getValue(&msgSeqNum.super_SeqNumField);
      beginSeqNo = uVar6 + 1;
    }
    generateSequenceReset(this,beginSeqNo,uVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)messageString._M_dataplus._M_p != &messageString.field_2) {
    operator_delete(messageString._M_dataplus._M_p,
                    CONCAT71(messageString.field_2._M_allocated_capacity._1_7_,
                             messageString.field_2._M_local_buf[0]) + 1);
  }
  FieldBase::~FieldBase((FieldBase *)&msgType);
  FieldBase::~FieldBase((FieldBase *)&msgSeqNum);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&messages);
  return;
}

Assistant:

void Session::generateRetransmits(SEQNUM beginSeqNo, SEQNUM endSeqNo) {
  std::vector<std::string> messages;
  m_state.get(beginSeqNo, endSeqNo, messages);

  std::vector<std::string>::iterator i;
  MsgSeqNum msgSeqNum(0);
  MsgType msgType;
  SEQNUM begin = 0;
  SEQNUM current = beginSeqNo;
  bool appMessageJustSent = false;
  std::string messageString;

  for (i = messages.begin(); i != messages.end(); ++i) {
    appMessageJustSent = false;
    std::unique_ptr<FIX::Message> pMsg;
    std::string strMsgType;
    const DataDictionary &sessionDD = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());
    if (sessionDD.isMessageFieldsOrderPreserved()) {
      std::string::size_type equalSign = (*i).find("\00135=");
      equalSign += 4;
      std::string::size_type soh = (*i).find_first_of('\001', equalSign);
      strMsgType = (*i).substr(equalSign, soh - equalSign);
    }

    if (m_sessionID.isFIXT()) {
      Message msg;
      msg.setStringHeader(*i);
      ApplVerID applVerID;
      if (!msg.getHeader().getFieldIfSet(applVerID)) {
        applVerID = m_senderDefaultApplVerID;
      }

      const DataDictionary &applicationDD = m_dataDictionaryProvider.getApplicationDataDictionary(applVerID);
      if (strMsgType.empty()) {
        pMsg.reset(new Message(*i, sessionDD, applicationDD, m_validateLengthAndChecksum));
      } else {
        const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order &messageOrder = applicationDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(
            headerOrder,
            trailerOrder,
            messageOrder,
            *i,
            sessionDD,
            applicationDD,
            m_validateLengthAndChecksum));
      }
    } else {
      if (strMsgType.empty()) {
        pMsg.reset(new Message(*i, sessionDD, m_validateLengthAndChecksum));
      } else {
        const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
        const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
        const message_order &messageOrder = sessionDD.getMessageOrderedFields(strMsgType);
        pMsg.reset(new Message(headerOrder, trailerOrder, messageOrder, *i, sessionDD, m_validateLengthAndChecksum));
      }
    }

    Message &msg = *pMsg;

    msg.getHeader().getField(msgSeqNum);
    msg.getHeader().getField(msgType);

    if ((current != msgSeqNum) && !begin) {
      begin = current;
    }

    if (Message::isAdminMsgType(msgType)) {
      if (!begin) {
        begin = msgSeqNum;
      }
    } else {
      if (resend(msg)) {
        if (begin) {
          generateSequenceReset(begin, msgSeqNum);
        }
        send(msg.toString(messageString));
        m_state.onEvent("Resending Message: " + SEQNUM_CONVERTOR::convert(msgSeqNum));
        begin = 0;
        appMessageJustSent = true;
      } else {
        if (!begin) {
          begin = msgSeqNum;
        }
      }
    }
    current = msgSeqNum + 1;
  }
  if (begin) {
    generateSequenceReset(begin, msgSeqNum + 1);
  }

  if (endSeqNo > msgSeqNum) {
    endSeqNo = EndSeqNo(endSeqNo + 1);
    auto next = m_state.getNextSenderMsgSeqNum();
    if (endSeqNo > next) {
      endSeqNo = EndSeqNo(next);
    }
    if (appMessageJustSent) {
      beginSeqNo = msgSeqNum + 1;
    }
    generateSequenceReset(beginSeqNo, endSeqNo);
  }
}